

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcRootLogLikelihoodsByPartition
          (BeagleCPU4StateImpl<double,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          int partitionCount,double *outSumLogLikelihoodByPartition)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int *piVar19;
  double **ppdVar20;
  double **ppdVar21;
  double *pdVar22;
  double *pdVar23;
  double *pdVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  ulong uVar30;
  double *pdVar31;
  long lVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  
  if (0 < partitionCount) {
    piVar19 = (this->super_BeagleCPUImpl<double,_1,_0>).gPatternPartitionsStartPatterns;
    ppdVar20 = (this->super_BeagleCPUImpl<double,_1,_0>).gPartials;
    ppdVar21 = (this->super_BeagleCPUImpl<double,_1,_0>).gCategoryWeights;
    pdVar22 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
    uVar13 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
    iVar14 = (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount;
    iVar15 = (this->super_BeagleCPUImpl<double,_1,_0>).kExtraPatterns;
    uVar26 = 0;
    do {
      iVar16 = piVar19[partitionIndices[uVar26]];
      iVar17 = piVar19[(long)partitionIndices[uVar26] + 1];
      pdVar31 = ppdVar20[bufferIndices[uVar26]];
      pdVar23 = ppdVar21[categoryWeightsIndices[uVar26]];
      iVar18 = iVar16 * 4;
      iVar29 = iVar18;
      if (iVar17 - iVar16 != 0 && iVar16 <= iVar17) {
        dVar1 = *pdVar23;
        iVar29 = iVar17 - iVar16;
        lVar27 = 0;
        do {
          pdVar22[iVar18 + lVar27] = dVar1 * pdVar31[iVar18 + lVar27];
          pdVar22[(long)iVar18 + lVar27 + 1] = dVar1 * pdVar31[(long)iVar18 + lVar27 + 1];
          pdVar22[(long)iVar18 + lVar27 + 2] = dVar1 * pdVar31[(long)iVar18 + lVar27 + 2];
          pdVar22[(long)iVar18 + lVar27 + 3] = dVar1 * pdVar31[(long)iVar18 + lVar27 + 3];
          lVar27 = lVar27 + 4;
          iVar29 = iVar29 + -1;
        } while (iVar29 != 0);
        iVar29 = iVar18 + (int)lVar27;
      }
      if (1 < (int)uVar13) {
        pdVar24 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
        uVar30 = 1;
        do {
          iVar29 = iVar29 + ((iVar16 - iVar17) + iVar14) * 4;
          if (iVar16 < iVar17) {
            auVar34._8_8_ = 0;
            auVar34._0_8_ = pdVar23[uVar30];
            lVar27 = 0;
            iVar25 = iVar17 - iVar16;
            do {
              auVar37._8_8_ = 0;
              auVar37._0_8_ = pdVar31[iVar29 + lVar27];
              auVar5._8_8_ = 0;
              auVar5._0_8_ = pdVar24[iVar18 + lVar27];
              auVar5 = vfmadd213sd_fma(auVar37,auVar34,auVar5);
              pdVar24[iVar18 + lVar27] = auVar5._0_8_;
              auVar38._8_8_ = 0;
              auVar38._0_8_ = pdVar31[(long)iVar29 + lVar27 + 1];
              auVar6._8_8_ = 0;
              auVar6._0_8_ = pdVar24[(long)iVar18 + lVar27 + 1];
              auVar5 = vfmadd213sd_fma(auVar38,auVar34,auVar6);
              pdVar24[(long)iVar18 + lVar27 + 1] = auVar5._0_8_;
              auVar39._8_8_ = 0;
              auVar39._0_8_ = pdVar31[(long)iVar29 + lVar27 + 2];
              auVar7._8_8_ = 0;
              auVar7._0_8_ = pdVar24[(long)iVar18 + lVar27 + 2];
              auVar5 = vfmadd213sd_fma(auVar39,auVar34,auVar7);
              pdVar24[(long)iVar18 + lVar27 + 2] = auVar5._0_8_;
              auVar40._8_8_ = 0;
              auVar40._0_8_ = pdVar31[(long)iVar29 + lVar27 + 3];
              auVar8._8_8_ = 0;
              auVar8._0_8_ = pdVar24[(long)iVar18 + lVar27 + 3];
              auVar5 = vfmadd213sd_fma(auVar40,auVar34,auVar8);
              pdVar24[(long)iVar18 + lVar27 + 3] = auVar5._0_8_;
              lVar27 = lVar27 + 4;
              iVar25 = iVar25 + -1;
            } while (iVar25 != 0);
            iVar29 = iVar29 + (int)lVar27;
          }
          iVar29 = iVar29 + iVar15 * 4;
          uVar30 = uVar30 + 1;
        } while (uVar30 != uVar13);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != (uint)partitionCount);
  }
  if (0 < partitionCount) {
    pdVar22 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
    uVar26 = 0;
    do {
      piVar19 = (this->super_BeagleCPUImpl<double,_1,_0>).gPatternPartitionsStartPatterns;
      iVar14 = piVar19[partitionIndices[uVar26]];
      lVar32 = (long)iVar14;
      iVar15 = piVar19[(long)partitionIndices[uVar26] + 1];
      lVar27 = (long)iVar15;
      iVar18 = cumulativeScaleIndices[uVar26];
      if (iVar14 < iVar15) {
        pdVar31 = (this->super_BeagleCPUImpl<double,_1,_0>).gStateFrequencies
                  [stateFrequenciesIndices[uVar26]];
        dVar1 = *pdVar31;
        dVar2 = pdVar31[1];
        dVar3 = pdVar31[2];
        dVar4 = pdVar31[3];
        pdVar31 = pdVar22 + (long)(iVar14 * 4) + 3;
        lVar28 = lVar32;
        do {
          auVar41._8_8_ = 0;
          auVar41._0_8_ = dVar1;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = pdVar31[-3];
          auVar35._8_8_ = 0;
          auVar35._0_8_ = dVar2 * pdVar31[-2];
          auVar34 = vfmadd231sd_fma(auVar35,auVar41,auVar9);
          auVar42._8_8_ = 0;
          auVar42._0_8_ = dVar3;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = pdVar31[-1];
          auVar34 = vfmadd231sd_fma(auVar34,auVar42,auVar10);
          auVar43._8_8_ = 0;
          auVar43._0_8_ = dVar4;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = *pdVar31;
          auVar34 = vfmadd231sd_fma(auVar34,auVar43,auVar11);
          dVar33 = log(auVar34._0_8_);
          (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp[lVar28] = dVar33;
          lVar28 = lVar28 + 1;
          pdVar31 = pdVar31 + 4;
        } while (lVar27 != lVar28);
      }
      if ((iVar18 != -1) && (iVar14 < iVar15)) {
        pdVar31 = (this->super_BeagleCPUImpl<double,_1,_0>).gScaleBuffers[iVar18];
        pdVar23 = (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp;
        lVar28 = lVar32;
        do {
          pdVar23[lVar28] = pdVar31[lVar28] + pdVar23[lVar28];
          lVar28 = lVar28 + 1;
        } while (lVar27 != lVar28);
      }
      outSumLogLikelihoodByPartition[uVar26] = 0.0;
      if (iVar14 < iVar15) {
        pdVar31 = (this->super_BeagleCPUImpl<double,_1,_0>).gPatternWeights;
        pdVar23 = (this->super_BeagleCPUImpl<double,_1,_0>).outLogLikelihoodsTmp;
        auVar36 = ZEXT864(0) << 0x40;
        do {
          auVar44._8_8_ = 0;
          auVar44._0_8_ = pdVar23[lVar32];
          auVar12._8_8_ = 0;
          auVar12._0_8_ = pdVar31[lVar32];
          auVar34 = vfmadd231sd_fma(auVar36._0_16_,auVar44,auVar12);
          auVar36 = ZEXT1664(auVar34);
          outSumLogLikelihoodByPartition[uVar26] = auVar34._0_8_;
          lVar32 = lVar32 + 1;
        } while (lVar27 != lVar32);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != (uint)partitionCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByPartition(
                                                                    const int* bufferIndices,
                                                                    const int* categoryWeightsIndices,
                                                                    const int* stateFrequenciesIndices,
                                                                    const int* cumulativeScaleIndices,
                                                                    const int* partitionIndices,
                                                                    int partitionCount,
                                                                    double* outSumLogLikelihoodByPartition) {


    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        const REALTYPE* rootPartials = gPartials[bufferIndices[p]];
        assert(rootPartials);
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[p]];

        int v = startPattern * 4;
        const REALTYPE wt0 = wt[0];
        for (int k = startPattern; k < endPattern; k++) {
            integrationTmp[v    ] = rootPartials[v    ] * wt0;
            integrationTmp[v + 1] = rootPartials[v + 1] * wt0;
            integrationTmp[v + 2] = rootPartials[v + 2] * wt0;
            integrationTmp[v + 3] = rootPartials[v + 3] * wt0;
            v += 4;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            int u = startPattern * 4;
            v += ((kPatternCount - endPattern) + startPattern) * 4;
            const REALTYPE wtl = wt[l];
            for (int k = startPattern; k < endPattern; k++) {
                integrationTmp[u    ] += rootPartials[v    ] * wtl;
                integrationTmp[u + 1] += rootPartials[v + 1] * wtl;
                integrationTmp[u + 2] += rootPartials[v + 2] * wtl;
                integrationTmp[u + 3] += rootPartials[v + 3] * wtl;

                u += 4;
                v += 4;
            }
        v += 4 * kExtraPatterns;
        }
    }
    integrateOutStatesAndScaleByPartition(integrationTmp, stateFrequenciesIndices, cumulativeScaleIndices, partitionIndices, partitionCount, outSumLogLikelihoodByPartition);
}